

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_kernel_c.h
# Opt level: O1

void __thiscall
dlib::
map_kernel_c<dlib::map_kernel_1<std::__cxx11::string,std::unique_ptr<dlib::logger::global_data::output_hook_container,std::default_delete<dlib::logger::global_data::output_hook_container>>,dlib::binary_search_tree_kernel_2<std::__cxx11::string,std::unique_ptr<dlib::logger::global_data::output_hook_container,std::default_delete<dlib::logger::global_data::output_hook_container>>,dlib::memory_manager_stateless_kernel_1<char>,std::less<std::__cxx11::string>>,dlib::memory_manager_stateless_kernel_1<char>>>
::remove_any(map_kernel_c<dlib::map_kernel_1<std::__cxx11::string,std::unique_ptr<dlib::logger::global_data::output_hook_container,std::default_delete<dlib::logger::global_data::output_hook_container>>,dlib::binary_search_tree_kernel_2<std::__cxx11::string,std::unique_ptr<dlib::logger::global_data::output_hook_container,std::default_delete<dlib::logger::global_data::output_hook_container>>,dlib::memory_manager_stateless_kernel_1<char>,std::less<std::__cxx11::string>>,dlib::memory_manager_stateless_kernel_1<char>>>
             *this)

{
  range *in_RDX;
  domain *in_RSI;
  
  map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  ::remove_any((map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                *)(this + -8),in_RSI,in_RDX);
  return;
}

Assistant:

void map_kernel_c<map_base>::
    remove_any (
        domain& d,
        range& r
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( (this->size() > 0)  &&
                (static_cast<void*>(&d) != static_cast<void*>(&r)),
            "\tvoid map::remove_any"
            << "\n\tsize() must be greater than zero if something is going to be removed"
            << "\n\tand d and r must not be the same variable."
            << "\n\tsize(): " << this->size() 
            << "\n\tthis:   " << this
            << "\n\t&d:     " << static_cast<void*>(&d)
            << "\n\t&r:     " << static_cast<void*>(&r)
            );

        // call the real function
        map_base::remove_any(d,r);
    }